

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool __thiscall TestOutputCoverage::Run(TestOutputCoverage *this)

{
  pointer *__ptr;
  Results rs;
  TestOutputCoverageInternal myTestA;
  TestRegistry r;
  long *local_14d8;
  string local_14d0;
  Test local_14b0;
  RunParams local_1470;
  TestRegistry local_1458;
  
  testinator::TestRegistry::TestRegistry(&local_1458);
  std::__cxx11::string::string((string *)&local_14b0,"TAP",(allocator *)&local_14d0);
  testinator::MakeOutputter((testinator *)&local_14d8,(string *)&local_14b0,OF_NONE);
  std::__cxx11::string::~string((string *)&local_14b0);
  std::__cxx11::string::string((string *)&local_14d0,"A",(allocator *)&local_1470);
  TestOutputCoverageInternal::TestOutputCoverageInternal
            ((TestOutputCoverageInternal *)&local_14b0,&local_1458,&local_14d0);
  std::__cxx11::string::~string((string *)&local_14d0);
  local_1470.m_flags = 0;
  local_1470._4_4_ = 0;
  local_1470.m_numPropertyChecks = 100;
  local_1470.m_randomSeed = 0;
  testinator::TestRegistry::RunAllTests
            ((Results *)&local_14d0,&local_1458,&local_1470,(Outputter *)0x0);
  std::vector<testinator::Result,_std::allocator<testinator::Result>_>::~vector
            ((vector<testinator::Result,_std::allocator<testinator::Result>_> *)&local_14d0);
  testinator::Test::~Test(&local_14b0);
  if (local_14d8 != (long *)0x0) {
    (**(code **)(*local_14d8 + 0x40))();
  }
  testinator::TestRegistry::~TestRegistry(&local_1458);
  return true;
}

Assistant:

DEF_TEST(OutputCoverage, Test)
{
  testinator::TestRegistry r;
  std::unique_ptr<testinator::Outputter> op =
    testinator::MakeOutputter("TAP", testinator::OF_NONE);
  TestOutputCoverageInternal myTestA(r, "A");
  testinator::Results rs = r.RunAllTests();
  return true;
}